

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

void __thiscall internalJSONNode::preparse(internalJSONNode *this)

{
  uint uVar1;
  JSONNode **ppJVar2;
  long lVar3;
  
  Fetch(this);
  if ((this->_type & 0xfe) == 4) {
    ppJVar2 = this->Children->array;
    uVar1 = this->Children->mysize;
    for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
      ::JSONNode::preparse(*(JSONNode **)((long)ppJVar2 + lVar3));
    }
  }
  return;
}

Assistant:

void internalJSONNode::preparse(void) json_nothrow {
	   Fetch();
	   if (isContainer()){
		  json_foreach(CHILDREN, myrunner){
			 (*myrunner) -> preparse();
		  }
	   }
    }